

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool packing_is_hlsl(BufferPackingStandard packing)

{
  bool local_9;
  BufferPackingStandard packing_local;
  
  local_9 = packing == BufferPackingHLSLCbuffer || packing == BufferPackingHLSLCbufferPackOffset;
  return local_9;
}

Assistant:

static bool packing_is_hlsl(BufferPackingStandard packing)
{
	switch (packing)
	{
	case BufferPackingHLSLCbuffer:
	case BufferPackingHLSLCbufferPackOffset:
		return true;

	default:
		return false;
	}
}